

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

streambuf_type *
tcb::unicode::
to_utf_string<char,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,char16_t>
          (istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> first,
          istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  streambuf_type *this;
  undefined2 in_R8W;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> first_00;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last_00;
  undefined4 uStack_50;
  undefined4 uStack_40;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last_local;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> first_local;
  string_type *output;
  
  this = first._M_sbuf;
  std::__cxx11::string::string((string *)this);
  uStack_40 = (undefined4)CONCAT62(first_local._M_sbuf._2_6_,(short)last._M_sbuf);
  uStack_50 = (undefined4)CONCAT62(last_local._M_sbuf._2_6_,in_R8W);
  out = std::back_inserter<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  last_00._8_4_ = uStack_50;
  last_00._M_sbuf = (streambuf_type *)last._8_8_;
  first_00._8_4_ = uStack_40;
  first_00._M_sbuf = (streambuf_type *)first._8_8_;
  first_00._12_4_ = 0;
  last_00._12_4_ = 0;
  utf_convert<char,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,std::back_insert_iterator<std::__cxx11::string>,char16_t>
            (first_00,last_00,out);
  return this;
}

Assistant:

std::basic_string<OutCharT>
to_utf_string(InputIt first, Sentinel last)
{
    using string_type = std::basic_string<OutCharT>;

    string_type output;

    // Try to minimise the number of reallocations
    if /*constexpr*/ (std::is_same<typename std::iterator_traits<InputIt>::iterator_category,
                                   std::random_access_iterator_tag>::value) {
        output.reserve(static_cast<typename string_type::size_type>(std::distance(first, last)));
    }

    utf_convert<OutCharT>(first, last, std::back_inserter(output));

    return output;
}